

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O0

QString * __thiscall QDBusXmlToCpp::propertyGetter(QDBusXmlToCpp *this,Property *property)

{
  bool bVar1;
  QChar QVar2;
  QMap<QString,_QDBusIntrospection::Annotation> *this_00;
  QChar *pQVar3;
  long in_RDX;
  QString *in_RSI;
  Annotation *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QString *getter;
  Annotation annotation;
  Annotation *in_stack_fffffffffffffe48;
  Annotation *in_stack_fffffffffffffe50;
  Annotation *defaultValue;
  QLatin1StringView in_stack_fffffffffffffe80;
  undefined1 local_138 [48];
  undefined1 local_a0 [88];
  SourceLocation local_48 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  defaultValue = in_RDI;
  memset(local_48,0xaa,0x40);
  this_00 = (QMap<QString,_QDBusIntrospection::Annotation> *)(in_RDX + 0x48);
  Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_stack_fffffffffffffe50);
  QString::QString((QString *)defaultValue,in_stack_fffffffffffffe80);
  memset(local_a0,0,0x40);
  QDBusIntrospection::Annotation::Annotation(in_stack_fffffffffffffe50);
  QMap<QString,_QDBusIntrospection::Annotation>::value(this_00,in_RSI,defaultValue);
  QDBusIntrospection::Annotation::~Annotation(in_stack_fffffffffffffe50);
  QString::~QString((QString *)0x107006);
  bVar1 = QString::isEmpty((QString *)0x107017);
  if (bVar1) {
    in_stack_fffffffffffffe50 = (Annotation *)(in_RDX + 0x48);
    latin1 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_RDI,(size_t)in_stack_fffffffffffffe50);
    QString::QString((QString *)defaultValue,latin1);
    memset(local_138,0,0x40);
    QDBusIntrospection::Annotation::Annotation(in_stack_fffffffffffffe50);
    QMap<QString,_QDBusIntrospection::Annotation>::value(this_00,in_RSI,defaultValue);
    QDBusIntrospection::Annotation::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    QDBusIntrospection::Annotation::~Annotation(in_stack_fffffffffffffe50);
    QDBusIntrospection::Annotation::~Annotation(in_stack_fffffffffffffe50);
    QString::~QString((QString *)0x1070fd);
    bVar1 = QString::isEmpty((QString *)0x10710e);
    if (bVar1) {
      ((DataPointer *)&in_RDI->location)->d = (Data *)0xaaaaaaaaaaaaaaaa;
      ((DataPointer *)&in_RDI->location)->ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      (in_RDI->name).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48);
      QString::operator[]((QString *)in_stack_fffffffffffffe48,0x1071bf);
      QVar2 = QChar::toLower((QChar *)in_stack_fffffffffffffe50);
      pQVar3 = QString::operator[]((QString *)in_stack_fffffffffffffe48,0x1071da);
      pQVar3->ucs = QVar2.ucs;
    }
    else {
      DiagnosticsReporter::warning
                ((DiagnosticsReporter *)&in_RSI[8].d.ptr,local_48,
                 "deprecated annotation \'com.trolltech.QtDBus.propertyGetter\' found\n");
      DiagnosticsReporter::note
                ((DiagnosticsReporter *)&in_RSI[8].d.ptr,local_48,
                 "suggest updating to \'org.qtproject.QtDBus.PropertyGetter\'\n");
      QString::QString((QString *)in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48);
    }
  }
  else {
    QString::QString((QString *)in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48);
  }
  QDBusIntrospection::Annotation::~Annotation(in_stack_fffffffffffffe50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)defaultValue;
}

Assistant:

QString QDBusXmlToCpp::propertyGetter(const QDBusIntrospection::Property &property)
{
    auto annotation = property.annotations.value("org.qtproject.QtDBus.PropertyGetter"_L1);
    if (!annotation.value.isEmpty())
        return annotation.value;

    annotation = property.annotations.value("com.trolltech.QtDBus.propertyGetter"_L1);
    if (!annotation.value.isEmpty()) {
        reporter.warning(annotation.location,
                         "deprecated annotation 'com.trolltech.QtDBus.propertyGetter' found\n");
        reporter.note(annotation.location,
                      "suggest updating to 'org.qtproject.QtDBus.PropertyGetter'\n");
        return annotation.value;
    }

    QString getter = property.name;
    getter[0] = getter[0].toLower();
    return getter;
}